

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_AddSignConfidentialTx2_Test::TestBody
          (cfdcapi_elements_transaction_AddSignConfidentialTx2_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  bool in_stack_000000c7;
  char *in_stack_000000c8;
  int in_stack_000000d0;
  uint32_t in_stack_000000d4;
  char *in_stack_000000d8;
  char *in_stack_000000e0;
  void *in_stack_000000e8;
  char *in_stack_00000100;
  int64_t in_stack_00000108;
  char *in_stack_00000110;
  int in_stack_00000118;
  char **in_stack_00000128;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  char *str_buffer;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  char *stack;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  uint32_t count;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  undefined1 in_stack_00000326;
  undefined1 in_stack_00000327;
  int in_stack_00000328;
  uint32_t in_stack_0000032c;
  char *in_stack_00000330;
  AssertionResult gtest_ar_3;
  char *signature;
  AssertionResult gtest_ar_2;
  int in_stack_00000378;
  AssertionResult gtest_ar_1;
  char *tx_string;
  char *sighash;
  int64_t satoshi;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffbb8;
  AssertionResult *in_stack_fffffffffffffbc0;
  uint *rhs;
  CfdErrorCode *in_stack_fffffffffffffbc8;
  CfdErrorCode *lhs;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffbdc;
  void *in_stack_fffffffffffffbf8;
  AssertionResult *this_00;
  char **in_stack_fffffffffffffc50;
  AssertionResult *in_stack_fffffffffffffc58;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined4 local_29c;
  AssertionResult local_298;
  AssertHelper local_288;
  Message local_280;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_254;
  AssertionResult local_250;
  char *local_240;
  AssertHelper local_238;
  Message local_230;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined4 local_204;
  AssertionResult local_200;
  char *local_1f0;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined4 local_1d4;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  undefined4 local_194;
  AssertHelper local_190;
  Message local_188;
  AssertionResult local_180;
  AssertHelper in_stack_fffffffffffffe90;
  uint32_t in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb0;
  AssertHelper in_stack_fffffffffffffeb8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  void *in_stack_fffffffffffffec8;
  AssertHelper local_128;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee0;
  AssertionResult local_110;
  uint *local_100;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t txin_index;
  char *in_stack_ffffffffffffff40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34a55a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x4b5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x34a5bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34a612);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,(type *)0x34a646);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x4b6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x34a742);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34a7bd);
  rhs = (uint *)0xbd2cc61d000;
  uVar5 = 0;
  uVar4 = 1;
  lhs = (CfdErrorCode *)0x0;
  local_14 = CfdCreateConfidentialSighash
                       (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,
                        in_stack_000000d0,in_stack_000000c8,in_stack_00000100,in_stack_00000108,
                        in_stack_00000110,in_stack_00000118,in_stack_000000c7,in_stack_00000128);
  txin_index = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,uVar5),
             (char *)CONCAT44(in_stack_fffffffffffffbd4,uVar4),lhs,(int *)rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff40);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34a8fd);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x4bf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&stack0xffffffffffffff30);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x34a960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34a9b5);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_e8,
               "\"c90939ef311f105806b401bcfa494921b8df297195fc125ebbd91a018c4066b9\"","sighash",
               "c90939ef311f105806b401bcfa494921b8df297195fc125ebbd91a018c4066b9",(char *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34aa64);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x4c1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x34aac7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34ab1f);
    local_100 = (uint *)0x0;
    local_14 = CfdCalculateEcSignature
                         (in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0.ptr_,
                          (char *)in_stack_fffffffffffffeb8.data_,
                          (char *)in_stack_fffffffffffffeb0.ptr_,in_stack_fffffffffffffeac,
                          SUB41(in_stack_fffffffffffffea8,3),(char **)in_stack_fffffffffffffee0.ptr_
                         );
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffbdc,uVar5),
               (char *)CONCAT44(in_stack_fffffffffffffbd4,uVar4),lhs,(int *)rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffee0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34ac19);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x4c8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_128,(Message *)&stack0xfffffffffffffee0);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x34ac7c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34acd1);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffec8,
                 "\"0268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c2131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea\""
                 ,"signature",
                 "0268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c2131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea"
                 ,(char *)local_100);
      uVar3 = (undefined4)((ulong)lhs >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffec8);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffec0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34ad80);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffeb8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x4cb,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffeb8,(Message *)&stack0xfffffffffffffec0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb8);
        testing::Message::~Message((Message *)0x34ade3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34ae3b);
      uVar5 = 0;
      uVar4 = 1;
      lhs = (CfdErrorCode *)CONCAT44(uVar3,1);
      rhs = local_100;
      local_14 = CfdAddPubkeyHashSign
                           (signature,gtest_ar_3.message_.ptr_._4_4_,(char *)gtest_ar_3._0_8_,
                            in_stack_00000330,in_stack_0000032c,in_stack_00000328,
                            (char *)gtest_ar_2._0_8_,(char *)gtest_ar_2.message_.ptr_,
                            (bool)in_stack_00000327,in_stack_00000378,(bool)in_stack_00000326,
                            (char **)gtest_ar_1._0_8_);
      in_stack_fffffffffffffea4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,uVar5),
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,uVar4),lhs,(int *)rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffea8);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffe98);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34af52);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x4d1,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe90,(Message *)&stack0xfffffffffffffe98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe90);
        testing::Message::~Message((Message *)0x34afb5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34b00a);
      CfdFreeStringBuffer((char *)lhs);
    }
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_180,
                 "\"0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000\""
                 ,"tx_string",
                 "0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000"
                 ,(char *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
      if (!bVar1) {
        testing::Message::Message(&local_188);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34b0c8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x4d6,pcVar2);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        testing::Message::~Message((Message *)0x34b12b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34b183);
      local_194 = 0;
      local_14 = CfdGetConfidentialTxInWitnessCount
                           ((void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            in_stack_fffffffffffffe9c,&(in_stack_fffffffffffffe90.data_)->type);
      local_1ac = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,uVar5),
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,uVar4),lhs,(int *)rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
      if (!bVar1) {
        testing::Message::Message(&local_1b8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34b261);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x4da,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        testing::Message::~Message((Message *)0x34b2c4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34b319);
      local_1d4 = 2;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,uVar5),
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,uVar4),lhs,rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1e0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34b3c6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x4db,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
        testing::internal::AssertHelper::~AssertHelper(&local_1e8);
        testing::Message::~Message((Message *)0x34b429);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34b481);
      local_1f0 = (char *)0x0;
      local_14 = CfdGetConfidentialTxInWitness
                           (in_stack_ffffffffffffff48.ptr_,in_stack_ffffffffffffff40,txin_index,
                            in_stack_ffffffffffffff38,(char **)in_stack_ffffffffffffff30.ptr_);
      local_204 = 0;
      in_stack_fffffffffffffc58 = &local_200;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,uVar5),
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,uVar4),lhs,(int *)rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc58);
      if (!bVar1) {
        testing::Message::Message(&local_210);
        in_stack_fffffffffffffc50 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x34b565);
        testing::internal::AssertHelper::AssertHelper
                  (&local_218,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x4df,(char *)in_stack_fffffffffffffc50);
        testing::internal::AssertHelper::operator=(&local_218,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_218);
        testing::Message::~Message((Message *)0x34b5c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34b61d);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_228,
                 "\"03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6\"","stack",
                 "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6",local_1f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
      if (!bVar1) {
        testing::Message::Message(&local_230);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34b6be);
        testing::internal::AssertHelper::AssertHelper
                  (&local_238,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x4e0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_238,&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_238);
        testing::Message::~Message((Message *)0x34b721);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34b776);
      if (local_14 == 0) {
        CfdFreeStringBuffer((char *)lhs);
      }
    }
    CfdFreeStringBuffer((char *)lhs);
  }
  CfdFreeStringBuffer((char *)lhs);
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffbf8);
  if (local_14 != 0) {
    local_240 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    local_254 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffbdc,uVar5),
               (char *)CONCAT44(in_stack_fffffffffffffbd4,uVar4),lhs,(int *)rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34b896);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x4ef,pcVar2);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x34b8f3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34b948);
    testing::internal::CmpHelperSTREQ((internal *)&local_278,"\"\"","str_buffer","",local_240);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message(&local_280);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34b9dd);
      testing::internal::AssertHelper::AssertHelper
                (&local_288,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x4f0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_288,&local_280);
      testing::internal::AssertHelper::~AssertHelper(&local_288);
      testing::Message::~Message((Message *)0x34ba3a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34ba8f);
    CfdFreeStringBuffer((char *)lhs);
    local_240 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(lhs);
  local_29c = 0;
  this_00 = &local_298;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,uVar5),
             (char *)CONCAT44(in_stack_fffffffffffffbd4,uVar4),lhs,(int *)rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34bb5f);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x4f6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    testing::Message::~Message((Message *)0x34bbbc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34bc11);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddSignConfidentialTx2) {
  static const char* const kTxData = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int64_t satoshi = 13000000000000;
  char* sighash = nullptr;
  char* tx_string = nullptr;
  ret = CfdCreateConfidentialSighash(
      handle, kTxData, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
      kCfdP2wpkh, "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6", nullptr,
      satoshi, nullptr, kCfdSigHashAll, false, &sighash);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("c90939ef311f105806b401bcfa494921b8df297195fc125ebbd91a018c4066b9", sighash);

    // calc
    char* signature = nullptr;
    static const char* privkey = "cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1";
    ret = CfdCalculateEcSignature(
      handle, sighash, nullptr, privkey, kCfdNetworkRegtest, true, &signature);
    EXPECT_EQ(kCfdSuccess, ret);

    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c2131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea", signature);
      ret = CfdAddPubkeyHashSign(
        handle, kCfdNetworkElementsRegtest, kTxData,
        "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0, kCfdP2wpkh,
        "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6", signature,
        true, kCfdSigHashAll, false, &tx_string);
      EXPECT_EQ(kCfdSuccess, ret);
      CfdFreeStringBuffer(signature);
    }

    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000", tx_string);

      uint32_t count = 0;
      ret = CfdGetConfidentialTxInWitnessCount(handle, tx_string, 0, &count);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(2, count);

      char* stack = nullptr;
      ret = CfdGetConfidentialTxInWitness(handle, tx_string, 0, 1, &stack);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_STREQ("03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6", stack);
      if (ret == kCfdSuccess) {
        CfdFreeStringBuffer(stack);
      }
    }

    CfdFreeStringBuffer(sighash);
  }

  CfdFreeStringBuffer(tx_string);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}